

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  exception *e;
  ostringstream oss_28;
  callback<void_(int)> f_8;
  intrusive_ptr<myicall> mc_7;
  ostringstream oss_27;
  callback<void_(int)> f_7;
  unique_ptr<myicall,_std::default_delete<myicall>_> mc_6;
  ostringstream oss_26;
  callback<void_(int)> f_6;
  intrusive_ptr<myicall> mc_5;
  ostringstream oss_25;
  callback<void_(int)> f_5;
  unique_ptr<myicall,_std::default_delete<myicall>_> mc_4;
  ostringstream oss_24;
  callback<void_()> f_4;
  intrusive_ptr<mycall> mc_3;
  ostringstream oss_23;
  callback<void_()> f_3;
  unique_ptr<mycall,_std::default_delete<mycall>_> mc_2;
  ostringstream oss_22;
  callback<void_()> f_2;
  intrusive_ptr<mycall> mc_1;
  ostringstream oss_21;
  callback<void_()> f_1;
  unique_ptr<mycall,_std::default_delete<mycall>_> mc;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  callback<void_()> c2_1;
  callback<void_()> c_1;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  callback<void_()> c2;
  callback<void_()> c;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  callback<int_()> fcnt2;
  callback<int_()> fcnt1;
  ostringstream oss_8;
  ostringstream oss_7;
  int x;
  ostringstream oss_6;
  ostringstream oss_5;
  bad_callback_call *e_1;
  ostringstream oss_4;
  callback<void_(int)> fvi;
  ostringstream oss_3;
  ostringstream oss_2;
  callback<int_()> fi;
  ostringstream oss_1;
  ostringstream oss;
  callback<void_()> f;
  callback<int_()> *in_stack_ffffffffffffca30;
  undefined4 in_stack_ffffffffffffca38;
  int in_stack_ffffffffffffca3c;
  callback<void_(int)> *in_stack_ffffffffffffca40;
  string local_848 [32];
  ostringstream local_828 [391];
  undefined1 local_6a1;
  string local_6a0 [32];
  ostringstream local_680 [383];
  undefined1 local_501;
  string local_500 [32];
  ostringstream local_4e0 [391];
  undefined1 local_359;
  string local_358 [32];
  ostringstream local_338 [383];
  undefined1 local_1b9;
  string local_1b8 [32];
  ostringstream local_198 [404];
  undefined4 local_4;
  
  local_4 = 0;
  reset();
  booster::callback<void()>::callback<void(*)()>
            ((callback<void_()> *)in_stack_ffffffffffffca40,
             (_func_void *)CONCAT44(in_stack_ffffffffffffca3c,in_stack_ffffffffffffca38));
  booster::callback<void_()>::operator()((callback<void_()> *)in_stack_ffffffffffffca30);
  if ((foov_called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
    std::operator<<(poVar3," foov_called");
    local_1b9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1b8);
    local_1b9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<void()>::operator=
            ((callback<void_()> *)in_stack_ffffffffffffca40,
             (_func_int *)CONCAT44(in_stack_ffffffffffffca3c,in_stack_ffffffffffffca38));
  booster::callback<void_()>::operator()((callback<void_()> *)in_stack_ffffffffffffca30);
  if ((fooi_called & 1U) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_338);
    poVar3 = std::operator<<((ostream *)local_338,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d);
    std::operator<<(poVar3," fooi_called");
    local_359 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_358);
    local_359 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<int()>::callback<int(*)()>
            ((callback<int_()> *)in_stack_ffffffffffffca40,
             (_func_int *)CONCAT44(in_stack_ffffffffffffca3c,in_stack_ffffffffffffca38));
  iVar2 = booster::callback<int_()>::operator()(in_stack_ffffffffffffca30);
  if (iVar2 != 10) {
    std::__cxx11::ostringstream::ostringstream(local_4e0);
    poVar3 = std::operator<<((ostream *)local_4e0,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4f);
    std::operator<<(poVar3," fi()==10");
    local_501 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_500);
    local_501 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::callback::operator_cast_to_bool((callback<int_()> *)0x109b29);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_680);
    poVar3 = std::operator<<((ostream *)local_680,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
    std::operator<<(poVar3," fi");
    local_6a1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_6a0);
    local_6a1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<void_(int)>::callback((callback<void_(int)> *)0x109cd6);
  bVar1 = booster::callback::operator_cast_to_bool((callback<void_(int)> *)0x109ce7);
  if (!bVar1) {
    booster::callback<void_(int)>::operator()(in_stack_ffffffffffffca40,in_stack_ffffffffffffca3c);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Not throws!");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_828);
  poVar3 = std::operator<<((ostream *)local_828,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
  std::operator<<(poVar3," !fvi");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar4,local_848);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	using booster::callback;
	try {
		reset();
		callback<void()> f=foov;
		f();
		TEST(foov_called);
		f=fooi;
		f();
		TEST(fooi_called);
		callback<int()> fi=fooi;
		TEST(fi()==10);
		TEST(fi);
		callback<void(int)> fvi;
		TEST(!fvi);
		try {
			fvi(10);
			throw std::runtime_error("Not throws!");
		}
		catch(booster::bad_callback_call const &e) {}
		fvi=fooid;
		TEST(fvi);
		fvi(10);
		TEST(fooid_called);
		int x=2;
		TEST(callback<int(int&)>(fooii)(x)==2);
		TEST(x==3);

		callback<int()> fcnt1=call_counter();
		callback<int()> fcnt2=fcnt1;
		TEST(fcnt1()==1);
		TEST(fcnt1()==2);
		TEST(fcnt2()==3);
		TEST(fcnt2()==4);

		{
			// move copy
			foov_called = false;
			callback<void()> c(foov);
			callback<void()> c2(std::move(c));
			TEST(c.empty());
			TEST(!c2.empty());
			c2();
			TEST(foov_called);
			foov_called=false;
		}
		{
			// move assignment
			foov_called = false;
			callback<void()> c(foov);
			callback<void()> c2(reset);
			TEST(!c.empty());
			TEST(!c2.empty());
			c2 = std::move(c);
			TEST(c.empty());
			TEST(!foov_called);
			c2();
			TEST(foov_called);
			foov_called=false;
		}
		
		{
			std::unique_ptr<mycall> mc(new mycall());
			callback<void()> f(std::move(mc));
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<mycall> mc(new mycall());
			callback<void()> f(mc);
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<mycall> mc(new mycall());
			callback<void()> f;
			f=std::move(mc);
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<mycall> mc(new mycall());
			callback<void()> f;
			f=mc;
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<myicall> mc(new myicall());
			callback<void(int)> f(std::move(mc));
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<myicall> mc(new myicall());
			callback<void(int)> f(mc);
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<myicall> mc(new myicall());
			callback<void(int)> f;
			f=std::move(mc);
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<myicall> mc(new myicall());
			callback<void(int)> f;
			f=mc;
			f(2);
			TEST(mycall_called); mycall_called=false;
		}


	}
	catch(std::exception const &e)
	{
		std::cout << "Fail"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}